

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int binCollFunc(void *NotUsed,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int iVar2;
  
  iVar2 = nKey1 - nKey2;
  if (nKey1 < nKey2) {
    nKey2 = nKey1;
  }
  iVar1 = memcmp(pKey1,pKey2,(long)nKey2);
  if (iVar1 == 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int binCollFunc(
  void *NotUsed,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int rc, n;
  UNUSED_PARAMETER(NotUsed);
  n = nKey1<nKey2 ? nKey1 : nKey2;
  /* EVIDENCE-OF: R-65033-28449 The built-in BINARY collation compares
  ** strings byte by byte using the memcmp() function from the standard C
  ** library. */
  assert( pKey1 && pKey2 );
  rc = memcmp(pKey1, pKey2, n);
  if( rc==0 ){
    rc = nKey1 - nKey2;
  }
  return rc;
}